

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

int __thiscall rengine::Node::remove(Node *this,char *__filename)

{
  bool bVar1;
  int extraout_EAX;
  Node *child_local;
  Node *this_local;
  
  if (__filename == (char *)0x0) {
    __assert_fail("child",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                  ,0x8c,"void rengine::Node::remove(Node *)");
  }
  bVar1 = hasChild(this,(Node *)__filename);
  if (!bVar1) {
    __assert_fail("hasChild(child)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                  ,0x8d,"void rengine::Node::remove(Node *)");
  }
  if (*(char **)(__filename + 0x20) == __filename) {
    this->m_child = (Node *)0x0;
  }
  else {
    if (this->m_child == (Node *)__filename) {
      this->m_child = *(Node **)(__filename + 0x20);
    }
    *(undefined8 *)(*(long *)(__filename + 0x20) + 0x28) = *(undefined8 *)(__filename + 0x28);
    *(undefined8 *)(*(long *)(__filename + 0x28) + 0x20) = *(undefined8 *)(__filename + 0x20);
  }
  __filename[0x20] = '\0';
  __filename[0x21] = '\0';
  __filename[0x22] = '\0';
  __filename[0x23] = '\0';
  __filename[0x24] = '\0';
  __filename[0x25] = '\0';
  __filename[0x26] = '\0';
  __filename[0x27] = '\0';
  __filename[0x28] = '\0';
  __filename[0x29] = '\0';
  __filename[0x2a] = '\0';
  __filename[0x2b] = '\0';
  __filename[0x2c] = '\0';
  __filename[0x2d] = '\0';
  __filename[0x2e] = '\0';
  __filename[0x2f] = '\0';
  setParent((Node *)__filename,(Node *)0x0);
  return extraout_EAX;
}

Assistant:

void remove(Node *child) {
        assert(child);
        assert(hasChild(child));

        // only child..
        if (child->m_next == child) {
            m_child = 0;
        } else {
            if (m_child == child)
                m_child = child->m_next;
            child->m_next->m_prev = child->m_prev;
            child->m_prev->m_next = child->m_next;
        }
        child->m_next = 0;
        child->m_prev = 0;
        child->setParent(0);
    }